

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O0

bool duckdb::NotLikeEscapeOperator::Operation<duckdb::string_t,duckdb::string_t,duckdb::string_t>
               (string_t str,string_t pattern,string_t escape)

{
  string_t escape_00;
  string_t pattern_00;
  string_t str_00;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  str_00.value.pointer.ptr = (char *)in_RDI;
  str_00.value._0_8_ = in_RCX;
  pattern_00.value.pointer.ptr = (char *)in_RDX;
  pattern_00.value._0_8_ = in_R9;
  escape_00.value.pointer.ptr = (char *)in_R8;
  escape_00.value._0_8_ = in_RSI;
  bVar1 = LikeEscapeOperator::Operation<duckdb::string_t,duckdb::string_t,duckdb::string_t>
                    (str_00,pattern_00,escape_00);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

static inline bool Operation(TA str, TB pattern, TC escape) {
		return !LikeEscapeOperator::Operation(str, pattern, escape);
	}